

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy>::
decode_value(jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy> *this,
            int32_t k,int32_t limit,int32_t quantized_bits_per_pixel)

{
  int32_t iVar1;
  int iVar2;
  
  iVar1 = decoder_strategy::read_high_bits(&this->super_decoder_strategy);
  iVar2 = 1;
  if (iVar1 < ~quantized_bits_per_pixel + limit) {
    if (k == 0) {
      return iVar1;
    }
    iVar2 = iVar1 << ((byte)k & 0x1f);
    quantized_bits_per_pixel = k;
  }
  iVar1 = decoder_strategy::read_value(&this->super_decoder_strategy,quantized_bits_per_pixel);
  return iVar1 + iVar2;
}

Assistant:

int32_t decode_value(const int32_t k, const int32_t limit, const int32_t quantized_bits_per_pixel)
    {
        const int32_t high_bits{Strategy::read_high_bits()};

        if (high_bits >= limit - (quantized_bits_per_pixel + 1))
            return Strategy::read_value(quantized_bits_per_pixel) + 1;

        if (k == 0)
            return high_bits;

        return (high_bits << k) + Strategy::read_value(k);
    }